

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QStyleSheetStyle::unsetPalette(QStyleSheetStyle *this,QWidget *w)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  char cVar7;
  bool bVar8;
  QPalette *pQVar9;
  QWidget *pQVar10;
  QWidget *w_00;
  ulong uVar11;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  long in_FS_OFFSET;
  iterator it;
  QPalette current;
  QWidget *w_local;
  QPalette local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  w_local = w;
  cVar7 = QCoreApplication::testAttribute(AA_UseStyleSheetPropagationInWidgetStyles);
  this_00 = (anon_union_24_3_e3d07ef4_for_data *)&styleSheetCaches->customPaletteWidgets;
  it = QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::findImpl<QWidget_const*>
                 ((QHash<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>> *)this_00->data,
                  &w_local);
  if (it.i.d != (Data<QHashPrivate::Node<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>_>
                 *)0x0 || it.i.bucket != 0) {
    pSVar2 = (it.i.d)->spans;
    uVar11 = it.i.bucket >> 7;
    pEVar3 = pSVar2[uVar11].entries;
    bVar1 = pSVar2[uVar11].offsets[(uint)it.i.bucket & 0x7f];
    local_48.shared = (PrivateShared *)*(undefined8 *)(pEVar3[bVar1].storage.data + 8);
    pEVar4 = pEVar3 + bVar1;
    (pEVar4->storage).data[8] = '\0';
    (pEVar4->storage).data[9] = '\0';
    (pEVar4->storage).data[10] = '\0';
    (pEVar4->storage).data[0xb] = '\0';
    (pEVar4->storage).data[0xc] = '\0';
    (pEVar4->storage).data[0xd] = '\0';
    (pEVar4->storage).data[0xe] = '\0';
    (pEVar4->storage).data[0xf] = '\0';
    local_48._12_4_ = 0xaaaaaaaa;
    local_48._8_4_ = *(undefined4 *)(pEVar3[bVar1].storage.data + 0x10);
    local_48._16_8_ = *(undefined8 *)(pEVar3[bVar1].storage.data + 0x18);
    QHash<const_QWidget_*,_QStyleSheetStyleCaches::Tampered<QPalette>_>::erase
              (&styleSheetCaches->customPaletteWidgets,(const_iterator)it.i);
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::QPalette((QPalette *)local_58);
    if (cVar7 == '\0') {
      QPalette::operator=((QPalette *)local_58,(QPalette *)&local_48);
    }
    else {
      pQVar9 = QWidget::palette(w_local);
      QPalette::QPalette(&local_78,pQVar9);
      current._8_8_ = &local_78;
      current.d = (QPalettePrivate *)&local_48;
      QStyleSheetStyleCaches::Tampered<QPalette>::reverted((Tampered<QPalette> *)local_68,current);
      uVar5 = local_58._0_8_;
      uVar6 = local_58._8_4_;
      local_58._8_4_ = local_68._8_4_;
      local_68._8_4_ = uVar6;
      local_58._0_8_ = local_68._0_8_;
      local_68._0_8_ = uVar5;
      QPalette::~QPalette((QPalette *)local_68);
      QPalette::~QPalette(&local_78);
    }
    QWidget::setPalette(w_local,(QPalette *)local_58);
    pQVar10 = embeddedWidget(w_local);
    if (pQVar10 != w_local) {
      QWidget::setPalette(pQVar10,(QPalette *)local_58);
    }
    QPalette::~QPalette((QPalette *)local_58);
    this_00 = &local_48;
    QPalette::~QPalette((QPalette *)this_00);
  }
  if (cVar7 == '\0') {
    local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QObject::property((char *)local_48.data);
    pQVar10 = w_local;
    if ((undefined1 *)0x3 < puStack_30) {
      qvariant_cast<QFont>((QVariant *)local_58);
      QWidget::setFont(pQVar10,(QFont *)local_58);
      QFont::~QFont((QFont *)local_58);
    }
    ::QVariant::~QVariant((QVariant *)&local_48);
  }
  else {
    unsetStyleSheetFont((QStyleSheetStyle *)this_00->data,w_local);
    pQVar10 = w_local;
    w_00 = embeddedWidget(w_local);
    if (w_00 != w_local) {
      unsetStyleSheetFont((QStyleSheetStyle *)pQVar10,w_00);
    }
  }
  bVar8 = QHash<const_QWidget_*,_QHashDummyValue>::contains
                    (&(styleSheetCaches->autoFillDisabledWidgets).q_hash,&w_local);
  if (bVar8) {
    pQVar10 = embeddedWidget(w_local);
    QWidget::setAutoFillBackground(pQVar10,true);
    QHash<QWidget_const*,QHashDummyValue>::removeImpl<QWidget_const*>
              ((QHash<QWidget_const*,QHashDummyValue> *)&styleSheetCaches->autoFillDisabledWidgets,
               &w_local);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::unsetPalette(QWidget *w)
{
    const bool useStyleSheetPropagationInWidgetStyles =
        QCoreApplication::testAttribute(Qt::AA_UseStyleSheetPropagationInWidgetStyles);

    const auto it = styleSheetCaches->customPaletteWidgets.find(w);
    if (it != styleSheetCaches->customPaletteWidgets.end()) {
        auto customizedPalette = std::move(*it);
        styleSheetCaches->customPaletteWidgets.erase(it);

        QPalette original;
        if (useStyleSheetPropagationInWidgetStyles)
            original = std::move(customizedPalette).reverted(w->palette());
        else
            original = customizedPalette.oldWidgetValue;

        w->setPalette(original);
        QWidget *ew = embeddedWidget(w);
        if (ew != w)
            ew->setPalette(original);
    }

    if (useStyleSheetPropagationInWidgetStyles) {
        unsetStyleSheetFont(w);
        QWidget *ew = embeddedWidget(w);
        if (ew != w)
            unsetStyleSheetFont(ew);
    } else {
        QVariant oldFont = w->property("_q_styleSheetWidgetFont");
        if (oldFont.isValid()) {
            w->setFont(qvariant_cast<QFont>(oldFont));
        }
    }

    if (styleSheetCaches->autoFillDisabledWidgets.contains(w)) {
        embeddedWidget(w)->setAutoFillBackground(true);
        styleSheetCaches->autoFillDisabledWidgets.remove(w);
    }
}